

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "------------ Running tests for Player class ------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[30m");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"constructor");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_Constructor();
  pcVar4 = "\x1b[31mFail";
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getOwnedCountries");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getOwnedCountries(true);
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getCards");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getHand(true);
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"getDiceRoller");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_getDiceRoller(true);
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"attack");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_attack();
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"reinforce");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_reinforce(true);
  pcVar3 = "\x1b[31mFail";
  if (bVar1) {
    pcVar3 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nTesting ");
  poVar2 = std::operator<<(poVar2,"Player");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"fortify");
  poVar2 = std::operator<<(poVar2,"() method: ");
  bVar1 = test_Player_fortify(true);
  if (bVar1) {
    pcVar4 = "\x1b[32mPass";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\x1b[30m");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running tests for Player class ------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m" << std::endl;

    std::cout << assert("Player", "constructor", test_Player_Constructor()) << std::endl;

    std::cout << assert("Player", "getOwnedCountries", test_Player_getOwnedCountries(true)) << std::endl;

    std::cout << assert("Player", "getCards", test_Player_getHand(true)) << std::endl;

    std::cout << assert("Player", "getDiceRoller", test_Player_getDiceRoller(true)) << std::endl;

    std::cout << assert("Player", "attack", test_Player_attack()) << std::endl;

    std::cout << assert("Player", "reinforce", test_Player_reinforce(true)) << std::endl;

    std::cout << assert("Player", "fortify", test_Player_fortify(true)) << std::endl;

}